

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O3

exr_result_t
reconstruct_chunk_table
          (exr_const_context_t_conflict ctxt,exr_const_priv_part_t part,uint64_t *chunktable)

{
  exr_priv_part_t *pp_Var1;
  ulong uVar2;
  exr_result_t eVar3;
  int iVar4;
  uint uVar5;
  void *__s;
  ulong uVar6;
  uint64_t uVar7;
  size_t __n;
  exr_const_priv_part_t p_Var8;
  int iVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  priv_chunk_leader leader;
  uint *in_stack_ffffffffffffff48;
  int local_a4;
  uint local_9c;
  uint64_t local_98;
  void *local_90;
  exr_const_context_t_conflict local_88;
  exr_const_priv_part_t local_80;
  uint64_t *local_78;
  size_t local_70;
  ulong local_68;
  uint64_t *local_60;
  priv_chunk_leader local_58;
  uint64_t local_38;
  
  pp_Var1 = ctxt->parts;
  uVar6 = (long)pp_Var1[(long)ctxt->num_parts + -1]->chunk_count * 8 +
          pp_Var1[(long)ctxt->num_parts + -1]->chunk_table_offset;
  local_98 = uVar6;
  local_88 = ctxt;
  local_80 = part;
  local_78 = chunktable;
  if (*pp_Var1 == part) {
    uVar14 = 0xffffffffffffffff;
    if (0 < ctxt->file_size) {
      uVar14 = ctxt->file_size;
    }
    uVar12 = 0;
  }
  else {
    uVar12 = 0;
    do {
      uVar13 = uVar12;
      uVar12 = uVar13 + 1;
    } while (pp_Var1[uVar13 + 1] != part);
    uVar14 = 0xffffffffffffffff;
    if (0 < ctxt->file_size) {
      uVar14 = ctxt->file_size;
    }
    p_Var8 = pp_Var1[uVar13 & 0xffffffff];
    eVar3 = extract_chunk_table(ctxt,p_Var8,&local_60,&local_38);
    ctxt = local_88;
    if (eVar3 != 0) {
      return eVar3;
    }
    if (0 < (long)p_Var8->chunk_count) {
      lVar10 = 0;
      uVar7 = uVar6;
      do {
        uVar2 = local_60[lVar10];
        uVar6 = uVar7;
        if (uVar2 < uVar14) {
          uVar6 = uVar2;
        }
        if (uVar2 <= uVar7) {
          uVar6 = uVar7;
        }
        lVar10 = lVar10 + 1;
        uVar7 = uVar6;
      } while (p_Var8->chunk_count != lVar10);
    }
    eVar3 = extract_chunk_leader(local_88,p_Var8,(int)uVar13,uVar6,&local_98,&local_58);
    if (eVar3 != 0) {
      return eVar3;
    }
  }
  p_Var8 = local_80;
  __n = (long)local_80->chunk_count << 3;
  __s = (*ctxt->alloc_fn)(__n);
  if (__s == (void *)0x0) {
    return 1;
  }
  memset(__s,0,__n);
  iVar4 = p_Var8->chunk_count;
  if (0 < iVar4) {
    iVar9 = -1;
    lVar10 = 0;
    local_a4 = 0;
    local_90 = __s;
    local_70 = __n;
    local_68 = uVar14;
    do {
      uVar6 = local_78[lVar10];
      uVar13 = local_98;
      if (uVar6 < local_68) {
        uVar13 = uVar6;
      }
      if (uVar6 < local_98) {
        uVar13 = local_98;
      }
      uVar5 = iVar4 + iVar9;
      if (p_Var8->lineorder != EXR_LINEORDER_DECREASING_Y) {
        uVar5 = (uint)lVar10;
      }
      local_98 = uVar13;
      eVar3 = extract_chunk_leader(ctxt,p_Var8,(int)uVar12,uVar13,&local_98,&local_58);
      if (eVar3 == 0) {
        if ((p_Var8->storage_mode & ~EXR_STORAGE_DEEP_SCANLINE) == EXR_STORAGE_SCANLINE) {
          lVar11 = (long)(p_Var8->data_window).min.y;
          uVar6 = (local_58.field_1.scanline_y - lVar11) / (long)p_Var8->lines_per_chunk;
          if ((((long)uVar6 < 0) || (uVar5 != (uint)uVar6)) ||
             ((long)p_Var8->chunk_count <= (long)uVar6)) {
            in_stack_ffffffffffffff48 =
                 (uint *)CONCAT44((int)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                                  (int)p_Var8->lines_per_chunk);
            eVar3 = (*local_88->print_error)
                              (local_88,0x16,
                               "Invalid chunk index: %ld reading scanline %d (datawindow min %d) with lines per chunk %d"
                               ,uVar6,(long)local_58.field_1.scanline_y,lVar11,
                               in_stack_ffffffffffffff48);
            goto LAB_00129cd9;
          }
        }
        else {
          local_9c = 0;
          in_stack_ffffffffffffff48 = &local_9c;
          eVar3 = validate_and_compute_tile_chunk_off
                            (ctxt,p_Var8,local_58.field_1.scanline_y,local_58.field_1.field_1.tile_y
                             ,local_58.field_1.field_1.level_x,local_58.field_1.field_1.level_y,
                             (int32_t *)in_stack_ffffffffffffff48);
          uVar6 = (ulong)local_9c;
LAB_00129cd9:
          uVar5 = (uint)uVar6;
          p_Var8 = local_80;
          if (eVar3 != 0) goto LAB_00129ce6;
        }
      }
      else {
LAB_00129ce6:
        if (local_a4 == 0) {
          local_a4 = eVar3;
        }
        uVar13 = 0;
      }
      iVar4 = p_Var8->chunk_count;
      if (((int)uVar5 < iVar4 && -1 < (int)uVar5) &&
         (*(long *)((long)local_90 + (ulong)uVar5 * 8) == 0)) {
        *(ulong *)((long)local_90 + (ulong)uVar5 * 8) = uVar13;
      }
      lVar10 = lVar10 + 1;
      iVar9 = iVar9 + -1;
      ctxt = local_88;
    } while (lVar10 < iVar4);
    __n = local_70;
    __s = local_90;
    if (local_a4 != 0) goto LAB_00129d72;
  }
  memcpy(local_78,__s,__n);
  local_a4 = 0;
LAB_00129d72:
  (*ctxt->free_fn)(__s);
  return local_a4;
}

Assistant:

static exr_result_t
reconstruct_chunk_table (
    exr_const_context_t ctxt, exr_const_priv_part_t part, uint64_t* chunktable)
{
    exr_result_t          rv          = EXR_ERR_SUCCESS;
    exr_result_t          firstfailrv = EXR_ERR_SUCCESS;
    uint64_t              offset_start, chunk_start, max_offset;
    uint64_t*             curctable;
    exr_const_priv_part_t curpart = NULL;
    int                   found_ci, computed_ci, partnum = 0;
    size_t                chunkbytes;

    curpart      = ctxt->parts[ctxt->num_parts - 1];
    offset_start = curpart->chunk_table_offset;
    offset_start += sizeof (uint64_t) * (uint64_t) curpart->chunk_count;

    curpart = ctxt->parts[partnum];
    while (curpart != part)
    {
        ++partnum;
        curpart = ctxt->parts[partnum];
    }

    max_offset = (uint64_t) -1;
    if (ctxt->file_size > 0) max_offset = (uint64_t) ctxt->file_size;

    // for multi-part, need to start at the first part and extract everything, then
    // work our way back up to this one, then grab the end of the previous part
    if (partnum > 0)
    {
        curpart = ctxt->parts[partnum - 1];
        rv      = extract_chunk_table (ctxt, curpart, &curctable, &chunk_start);
        if (rv != EXR_ERR_SUCCESS) return rv;

        chunk_start = offset_start;
        for (int ci = 0; ci < curpart->chunk_count; ++ci)
        {
            if (curctable[ci] > chunk_start && curctable[ci] < max_offset)
                chunk_start = curctable[ci];
        }

        rv = extract_chunk_size (
            ctxt, curpart, partnum - 1, chunk_start, &offset_start);
        if (rv != EXR_ERR_SUCCESS) return rv;
    }

    chunkbytes = (size_t) part->chunk_count * sizeof (uint64_t);
    curctable  = (uint64_t*) ctxt->alloc_fn (chunkbytes);
    if (!curctable) return EXR_ERR_OUT_OF_MEMORY;

    memset (curctable, 0, chunkbytes);
    for (int ci = 0; ci < part->chunk_count; ++ci)
    {
        if (chunktable[ci] >= offset_start && chunktable[ci] < max_offset)
        {
            offset_start = chunktable[ci];
        }
        chunk_start = offset_start;
        computed_ci = ci;
        if (part->lineorder == EXR_LINEORDER_DECREASING_Y)
            computed_ci = part->chunk_count - (ci + 1);
        found_ci = computed_ci;

        rv = read_and_validate_chunk_leader (
            ctxt, part, partnum, chunk_start, &found_ci, &offset_start);
        if (rv != EXR_ERR_SUCCESS)
        {
            chunk_start = 0;
            if (firstfailrv == EXR_ERR_SUCCESS) firstfailrv = rv;
        }

        if (found_ci >= 0 && found_ci < part->chunk_count)
        {
            if (curctable[found_ci] == 0) curctable[found_ci] = chunk_start;
        }
    }
    if (firstfailrv == EXR_ERR_SUCCESS)
        memcpy (chunktable, curctable, chunkbytes);
    ctxt->free_fn (curctable);

    return firstfailrv;
}